

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UBool __thiscall icu_63::LocalizationInfo::operator==(LocalizationInfo *this,LocalizationInfo *rhs)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint local_40;
  int j;
  int32_t ix;
  UChar *locale;
  int i_1;
  int32_t dlc;
  int i;
  int32_t rsc;
  LocalizationInfo *rhs_local;
  LocalizationInfo *this_local;
  
  if (rhs != (LocalizationInfo *)0x0) {
    if (this == rhs) {
      return '\x01';
    }
    iVar2 = (*this->_vptr_LocalizationInfo[3])();
    iVar3 = (*rhs->_vptr_LocalizationInfo[3])();
    if (iVar2 == iVar3) {
      for (i_1 = 0; i_1 < iVar2; i_1 = i_1 + 1) {
        iVar3 = (*this->_vptr_LocalizationInfo[4])(this,(ulong)(uint)i_1);
        iVar4 = (*rhs->_vptr_LocalizationInfo[4])(rhs,(ulong)(uint)i_1);
        UVar1 = streq((UChar *)CONCAT44(extraout_var,iVar3),(UChar *)CONCAT44(extraout_var_00,iVar4)
                     );
        if (UVar1 == '\0') {
          return '\0';
        }
      }
      iVar3 = (*this->_vptr_LocalizationInfo[5])();
      iVar4 = (*rhs->_vptr_LocalizationInfo[5])();
      if (iVar3 == iVar4) {
        locale._0_4_ = 0;
        while( true ) {
          if (iVar3 <= (int)(uint)locale) {
            return '\x01';
          }
          iVar4 = (*this->_vptr_LocalizationInfo[6])(this,(ulong)(uint)locale);
          uVar5 = (*rhs->_vptr_LocalizationInfo[8])(rhs,(UChar *)CONCAT44(extraout_var_01,iVar4));
          iVar6 = (*rhs->_vptr_LocalizationInfo[6])(rhs,(ulong)uVar5);
          UVar1 = streq((UChar *)CONCAT44(extraout_var_01,iVar4),
                        (UChar *)CONCAT44(extraout_var_02,iVar6));
          if (UVar1 == '\0') break;
          for (local_40 = 0; (int)local_40 < iVar2; local_40 = local_40 + 1) {
            iVar4 = (*this->_vptr_LocalizationInfo[7])(this,(ulong)(uint)locale,(ulong)local_40);
            iVar6 = (*rhs->_vptr_LocalizationInfo[7])(rhs,(ulong)uVar5,(ulong)local_40);
            UVar1 = streq((UChar *)CONCAT44(extraout_var_03,iVar4),
                          (UChar *)CONCAT44(extraout_var_04,iVar6));
            if (UVar1 == '\0') {
              return '\0';
            }
          }
          locale._0_4_ = (uint)locale + 1;
        }
        return '\0';
      }
    }
  }
  return '\0';
}

Assistant:

UBool
LocalizationInfo::operator==(const LocalizationInfo* rhs) const {
    if (rhs) {
        if (this == rhs) {
            return TRUE;
        }
        
        int32_t rsc = getNumberOfRuleSets();
        if (rsc == rhs->getNumberOfRuleSets()) {
            for (int i = 0; i < rsc; ++i) {
                if (!streq(getRuleSetName(i), rhs->getRuleSetName(i))) {
                    return FALSE;
                }
            }
            int32_t dlc = getNumberOfDisplayLocales();
            if (dlc == rhs->getNumberOfDisplayLocales()) {
                for (int i = 0; i < dlc; ++i) {
                    const UChar* locale = getLocaleName(i);
                    int32_t ix = rhs->indexForLocale(locale);
                    // if no locale, ix is -1, getLocaleName returns null, so streq returns false
                    if (!streq(locale, rhs->getLocaleName(ix))) {
                        return FALSE;
                    }
                    for (int j = 0; j < rsc; ++j) {
                        if (!streq(getDisplayName(i, j), rhs->getDisplayName(ix, j))) {
                            return FALSE;
                        }
                    }
                }
                return TRUE;
            }
        }
    }
    return FALSE;
}